

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.cpp
# Opt level: O0

wstring * fs_win32_to_wide_abi_cxx11_(string_view n)

{
  string_view path;
  char *in_RDX;
  error_code eVar1;
  string_view local_60;
  error_category *local_50;
  char *local_48;
  int local_40;
  undefined4 uStack_3c;
  error_category *local_38;
  undefined1 local_30 [8];
  error_code ec;
  string_view n_local;
  
  ec._M_cat = (error_category *)n._M_str;
  std::error_code::error_code((error_code *)local_30);
  eVar1 = std::make_error_code(function_not_supported);
  local_38 = eVar1._M_cat;
  local_40 = eVar1._M_value;
  local_30._4_4_ = uStack_3c;
  local_30._0_4_ = local_40;
  local_50 = ec._M_cat;
  local_48 = in_RDX;
  ec._0_8_ = local_38;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_60,"fs_win32_to_wide");
  path._M_str = local_48;
  path._M_len = (size_t)local_50;
  fs_print_error(path,local_60,(error_code *)local_30);
  std::__cxx11::wstring::wstring((wstring *)n._M_len);
  return (wstring *)n._M_len;
}

Assistant:

std::wstring fs_win32_to_wide(std::string_view n)
{
  std::error_code ec;

#if defined(_WIN32)
  // https://docs.microsoft.com/en-us/windows/win32/api/stringapiset/nf-stringapiset-multibytetowidechar

  if (int L = MultiByteToWideChar(CP_UTF8, 0, n.data(), -1, nullptr, 0); L > 0)  FFS_LIKELY
  {
    std::wstring buf(L, L'\0');
    if(MultiByteToWideChar(CP_UTF8, 0, n.data(), -1, buf.data(), L) > 0)  FFS_LIKELY
    {
      buf.resize(L-1);  // discard null terminator
      return buf;
    }
  }
#else
  ec = std::make_error_code(std::errc::function_not_supported);
#endif

  fs_print_error(n, __func__, ec);
  return {};
}